

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_settings_single_thread::set_str
          (session_settings_single_thread *this,int name,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *value_local;
  session_settings_single_thread *psStack_10;
  int name_local;
  session_settings_single_thread *this_local;
  
  local_20 = value;
  value_local._4_4_ = name;
  psStack_10 = this;
  ::std::__cxx11::string::string((string *)&local_40,(string *)value);
  set<std::__cxx11::string,std::array<std::__cxx11::string,13ul>>
            (this,&this->m_strings,name,&local_40,0);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void set_str(int name, std::string value)
		{ set<std::string>(m_strings, name, std::move(value), settings_pack::string_type_base); }